

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O2

void server_ping_all(void *server_void)

{
  EOClient *this;
  pair<unsigned_short,_unsigned_char> pVar1;
  long *plVar2;
  PacketBuilder builder;
  
  plVar2 = (long *)((long)server_void + 0x38);
  while (plVar2 = (long *)*plVar2, plVar2 != (long *)((long)server_void + 0x38)) {
    this = (EOClient *)plVar2[2];
    if (this->needpong == true) {
      Client::Close((Client *)this,false);
    }
    else {
      EOClient::PingNewSequence(this);
      pVar1 = EOClient::GetSeqUpdateBytes(this);
      PacketBuilder::PacketBuilder(&builder,PACKET_CONNECTION,PACKET_PLAYER,3);
      PacketBuilder::AddShort(&builder,(uint)pVar1 & 0xffff);
      PacketBuilder::AddChar(&builder,(uint)pVar1 >> 0x10 & 0xff);
      this->needpong = true;
      EOClient::Send(this,&builder);
      PacketBuilder::~PacketBuilder(&builder);
    }
  }
  return;
}

Assistant:

void server_ping_all(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->needpong)
		{
			client->Close();
		}
		else
		{
			client->PingNewSequence();
			auto seq_bytes = client->GetSeqUpdateBytes();

			PacketBuilder builder(PACKET_CONNECTION, PACKET_PLAYER, 3);
			builder.AddShort(seq_bytes.first);
			builder.AddChar(seq_bytes.second);

			client->needpong = true;
			client->Send(builder);
		}
	}
}